

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-utils.cpp
# Opt level: O0

void __thiscall
wasm::ParamUtils::localizeCallsTo(std::unordered_set<wasm::Name,std::hash<wasm::Name>,std::
equal_to<wasm::Name>,std::allocator<wasm::Name>>const&,wasm::Module&,wasm::PassRunner*,std::
function<void(wasm::Function*)>)::LocalizerPass::LocalizerPass(std::unordered_set<wasm::Name,std::
hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<wasm::Name>>const&,std::function<void(wasm
::Function__>_(void *this,
              unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
              *callTargets,function<void_(wasm::Function_*)> *onChange)

{
  function<void_(wasm::Function_*)> *onChange_local;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  *callTargets_local;
  LocalizerPass_conflict *this_local;
  
  WalkerPass<wasm::PostWalker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_>_>::WalkerPass
            ((WalkerPass<wasm::PostWalker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_>_> *)
             this);
  *(undefined ***)this = &PTR__LocalizerPass_03099ae0;
  *(unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
    **)((long)this + 0x130) = callTargets;
  std::function<void_(wasm::Function_*)>::function
            ((function<void_(wasm::Function_*)> *)((long)this + 0x138),onChange);
  *(undefined1 *)((long)this + 0x158) = 0;
  return;
}

Assistant:

LocalizerPass(const std::unordered_set<Name>& callTargets,
                  std::function<void(Function*)> onChange)
      : callTargets(callTargets), onChange(onChange) {}